

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  uint uVar2;
  CLua *this;
  int local_10;
  int retval;
  
  local_10 = 0;
  printf("Hello World!\n");
  this = (CLua *)operator_new(0x20);
  CLua::CLua(this);
  pLua = this;
  CLua::AddFunction(this,"FAIL",FAIL);
  CLua::AddFunction(pLua,myFunctions);
  bVar1 = CLua::RunString(pLua,"print(\'Test String has run\')");
  if (!bVar1) {
    printf("Failed to run c string\n");
    local_10 = -1;
  }
  bVar1 = CLua::RunScript(pLua,"scripttest.lua");
  if (!bVar1) {
    printf("Failed to run script file\n");
    local_10 = local_10 + -2;
  }
  uVar2 = sLuaBasedTestResult + local_10;
  if (uVar2 == 0) {
    printf("All tests passed\n");
  }
  else {
    printf("Some test failed: Guru Medition:%d",(ulong)uVar2);
  }
  return uVar2;
}

Assistant:

int main()
{
    int retval = 0;
    printf("Hello World!\n");

    pLua = new CLua();
    pLua->AddFunction("FAIL", FAIL);
    pLua->AddFunction(myFunctions);

    if (!pLua->RunString("print('Test String has run')"))
    {
        printf("Failed to run c string\n");
        retval += -1;
    }
    if (!pLua->RunScript("scripttest.lua"))
    {
        printf("Failed to run script file\n");
        retval += -2;
    }

    retval += sLuaBasedTestResult;

    if (retval == 0)
    {
        printf("All tests passed\n");
    }
    else
    {
        printf("Some test failed: Guru Medition:%d", retval);
    }
    
    return retval;
}